

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_wrapper.cpp
# Opt level: O1

string * __thiscall
daw::curl_wrapper::get_string_abi_cxx11_
          (string *__return_storage_ptr__,curl_wrapper *this,string_view url)

{
  _Head_base<0UL,_daw::curl_wrapper::impl_t_*,_false> _Var1;
  int iVar2;
  long lVar3;
  runtime_error *this_00;
  char *pcVar4;
  long *local_48 [2];
  long local_38 [2];
  
  curl_easy_setopt((__uniq_ptr_impl<void,_daw::cw_details::curl_deleter>)
                   (((this->m_impl)._M_t.
                     super___uniq_ptr_impl<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_daw::curl_wrapper::impl_t_*,_std::default_delete<daw::curl_wrapper::impl_t>_>
                     .super__Head_base<0UL,_daw::curl_wrapper::impl_t_*,_false>._M_head_impl)->curl)
                   ._M_t,99,1);
  curl_easy_setopt((__uniq_ptr_impl<void,_daw::cw_details::curl_deleter>)
                   (((this->m_impl)._M_t.
                     super___uniq_ptr_impl<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_daw::curl_wrapper::impl_t_*,_std::default_delete<daw::curl_wrapper::impl_t>_>
                     .super__Head_base<0UL,_daw::curl_wrapper::impl_t_*,_false>._M_head_impl)->curl)
                   ._M_t,0x2776,"deflate");
  curl_easy_setopt((__uniq_ptr_impl<void,_daw::cw_details::curl_deleter>)
                   (((this->m_impl)._M_t.
                     super___uniq_ptr_impl<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_daw::curl_wrapper::impl_t_*,_std::default_delete<daw::curl_wrapper::impl_t>_>
                     .super__Head_base<0UL,_daw::curl_wrapper::impl_t_*,_false>._M_head_impl)->curl)
                   ._M_t,0x2712,url._M_str);
  _Var1._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>
       ._M_t.
       super__Tuple_impl<0UL,_daw::curl_wrapper::impl_t_*,_std::default_delete<daw::curl_wrapper::impl_t>_>
       .super__Head_base<0UL,_daw::curl_wrapper::impl_t_*,_false>._M_head_impl;
  if (*(long *)&(_Var1._M_head_impl)->headers != 0) {
    curl_easy_setopt((__uniq_ptr_impl<void,_daw::cw_details::curl_deleter>)
                     ((_Var1._M_head_impl)->curl)._M_t,0x2a,1);
    _Var1._M_head_impl =
         (this->m_impl)._M_t.
         super___uniq_ptr_impl<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>
         ._M_t.
         super__Tuple_impl<0UL,_daw::curl_wrapper::impl_t_*,_std::default_delete<daw::curl_wrapper::impl_t>_>
         .super__Head_base<0UL,_daw::curl_wrapper::impl_t_*,_false>._M_head_impl;
    curl_easy_setopt((__uniq_ptr_impl<void,_daw::cw_details::curl_deleter>)
                     ((_Var1._M_head_impl)->curl)._M_t,0x2727,
                     (unique_ptr<curl_slist,_daw::cw_details::(anonymous_namespace)::curl_slist_deleter>
                      )(_Var1._M_head_impl)->headers);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  curl_easy_setopt((__uniq_ptr_impl<void,_daw::cw_details::curl_deleter>)
                   (((this->m_impl)._M_t.
                     super___uniq_ptr_impl<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_daw::curl_wrapper::impl_t_*,_std::default_delete<daw::curl_wrapper::impl_t>_>
                     .super__Head_base<0UL,_daw::curl_wrapper::impl_t_*,_false>._M_head_impl)->curl)
                   ._M_t,0x4e2b,cw_details::anon_unknown_0::write_handler);
  curl_easy_setopt((__uniq_ptr_impl<void,_daw::cw_details::curl_deleter>)
                   (((this->m_impl)._M_t.
                     super___uniq_ptr_impl<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_daw::curl_wrapper::impl_t_*,_std::default_delete<daw::curl_wrapper::impl_t>_>
                     .super__Head_base<0UL,_daw::curl_wrapper::impl_t_*,_false>._M_head_impl)->curl)
                   ._M_t,0x4e6f,cw_details::anon_unknown_0::header_handler);
  _Var1._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>
       ._M_t.
       super__Tuple_impl<0UL,_daw::curl_wrapper::impl_t_*,_std::default_delete<daw::curl_wrapper::impl_t>_>
       .super__Head_base<0UL,_daw::curl_wrapper::impl_t_*,_false>._M_head_impl;
  if ((_Var1._M_head_impl)->has_body == true) {
    curl_easy_setopt((__uniq_ptr_impl<void,_daw::cw_details::curl_deleter>)
                     ((_Var1._M_head_impl)->curl)._M_t,0x271f,
                     (pointer)((_Var1._M_head_impl)->body)._M_dataplus);
  }
  curl_easy_setopt((__uniq_ptr_impl<void,_daw::cw_details::curl_deleter>)
                   (((this->m_impl)._M_t.
                     super___uniq_ptr_impl<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_daw::curl_wrapper::impl_t_*,_std::default_delete<daw::curl_wrapper::impl_t>_>
                     .super__Head_base<0UL,_daw::curl_wrapper::impl_t_*,_false>._M_head_impl)->curl)
                   ._M_t,0x2711,__return_storage_ptr__);
  iVar2 = curl_easy_perform((__uniq_ptr_impl<void,_daw::cw_details::curl_deleter>)
                            (((this->m_impl)._M_t.
                              super___uniq_ptr_impl<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_daw::curl_wrapper::impl_t_*,_std::default_delete<daw::curl_wrapper::impl_t>_>
                              .super__Head_base<0UL,_daw::curl_wrapper::impl_t_*,_false>.
                             _M_head_impl)->curl)._M_t);
  if (iVar2 == 0) {
    if (*(long *)&((this->m_impl)._M_t.
                   super___uniq_ptr_impl<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_daw::curl_wrapper::impl_t_*,_std::default_delete<daw::curl_wrapper::impl_t>_>
                   .super__Head_base<0UL,_daw::curl_wrapper::impl_t_*,_false>._M_head_impl)->headers
        != 0) {
      lVar3 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x103021,0);
      if (lVar3 != -1) {
        std::__cxx11::string::substr((ulong)local_48,(ulong)__return_storage_ptr__);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_48);
        if (local_48[0] != local_38) {
          operator_delete(local_48[0],local_38[0] + 1);
        }
      }
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  pcVar4 = (char *)curl_easy_strerror(iVar2);
  std::runtime_error::runtime_error(this_00,pcVar4);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string curl_wrapper::get_string( std::string_view url ) {
		curl_easy_setopt( m_impl->curl.get( ), CURLOPT_NOSIGNAL, 1 );
		curl_easy_setopt( m_impl->curl.get( ), CURLOPT_ACCEPT_ENCODING, "deflate" );
		curl_easy_setopt( m_impl->curl.get( ), CURLOPT_URL, url.data( ) );
		if( m_impl->headers ) {
			curl_easy_setopt( m_impl->curl.get( ), CURLOPT_HEADER, true );
			curl_easy_setopt( m_impl->curl.get( ), CURLOPT_HTTPHEADER,
			                  m_impl->headers.get( ) );
		}
		std::string result;
		curl_easy_setopt( m_impl->curl.get( ), CURLOPT_WRITEFUNCTION,
		                  cw_details::write_handler );
		curl_easy_setopt( m_impl->curl.get( ), CURLOPT_HEADERFUNCTION,
		                  cw_details::header_handler );
		if( m_impl->has_body ) {
			curl_easy_setopt( m_impl->curl.get( ), CURLOPT_POSTFIELDS,
			                  m_impl->body.c_str( ) );
		}
		curl_easy_setopt( m_impl->curl.get( ), CURLOPT_WRITEDATA, &result );

		auto const curl_result = curl_easy_perform( m_impl->curl.get( ) );
		if( curl_result != CURLE_OK ) {
			throw std::runtime_error( curl_easy_strerror( curl_result ) );
		}
		if( m_impl->headers ) {
			// Cut out response headers
			auto pos = result.find( "\r\n\r\n" );
			if( pos != std::string::npos ) {
				result = result.substr( pos + 4 );
			}
		}
		return result;
	}